

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_handle_export_test.cpp
# Opt level: O2

void __thiscall
metacall_handle_export_test_DefaultConstructor_Test::
metacall_handle_export_test_DefaultConstructor_Test
          (metacall_handle_export_test_DefaultConstructor_Test *this)

{
  metacall_handle_export_test::metacall_handle_export_test(&this->super_metacall_handle_export_test)
  ;
  (this->super_metacall_handle_export_test).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_00140ca8;
  return;
}

Assistant:

TEST_F(metacall_handle_export_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

	void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
		const char *py_scripts[] = {
			"example.py"
		};

		void *v, *handle = NULL;

		char *value_str = NULL;

		size_t size = 0;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("py", py_scripts, sizeof(py_scripts) / sizeof(py_scripts[0]), &handle));

		ASSERT_NE((void *)NULL, (void *)handle);

		v = metacall_handle_export(handle);

		EXPECT_NE((void *)NULL, (void *)v);

		value_str = metacall_serialize(metacall_serial(), v, &size, allocator);

		EXPECT_NE((char *)NULL, (char *)value_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << value_str << std::endl;

		metacall_value_destroy(v);

		metacall_allocator_free(allocator, value_str);
	}
#endif /* OPTION_BUILD_LOADERS_PY */

/* NodeJS */
#if defined(OPTION_BUILD_LOADERS_NODE)
	{
		const char *node_scripts[] = {
			"nod.js"
		};

		void *v, *handle = NULL;

		char *value_str = NULL;

		size_t size = 0;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("node", node_scripts, sizeof(node_scripts) / sizeof(node_scripts[0]), &handle));

		ASSERT_NE((void *)NULL, (void *)handle);

		v = metacall_handle_export(handle);

		EXPECT_NE((void *)NULL, (void *)v);

		value_str = metacall_serialize(metacall_serial(), v, &size, allocator);

		EXPECT_NE((char *)NULL, (char *)value_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << value_str << std::endl;

		metacall_value_destroy(v);

		metacall_allocator_free(allocator, value_str);
	}
#endif /* OPTION_BUILD_LOADERS_NODE */

	/* Test bad handle allocation */
	{
		struct
		{
			int random;
			int broken;
			int handle;
			int yeet;
			char padding[600];
		} broken_handle = { 0, 0, 0, 0, { 0 } };

		EXPECT_EQ((void *)NULL, (void *)metacall_handle_export((void *)&broken_handle));
	}

	/* Print inspect information */
	{
		size_t size = 0;

		char *inspect_str = metacall_inspect(&size, allocator);

		EXPECT_NE((char *)NULL, (char *)inspect_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << inspect_str << std::endl;

		metacall_allocator_free(allocator, inspect_str);
	}

	metacall_allocator_destroy(allocator);

	metacall_destroy();
}